

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

void Dec_GraphUpdateNetwork(Abc_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNew;
  
  pNtk = pRoot->pNtk;
  iVar1 = pNtk->nObjCounts[7];
  pNew = Dec_GraphToNetwork(pNtk,pGraph);
  Abc_AigReplace((Abc_Aig_t *)pNtk->pManFunc,pRoot,pNew,fUpdateLevel);
  if (nGain <= iVar1 - pNtk->nObjCounts[7]) {
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/dec/decAbc.c"
                ,0xfd,"void Dec_GraphUpdateNetwork(Abc_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    extern Abc_Obj_t *    Dec_GraphToNetwork( Abc_Ntk_t * pNtk, Dec_Graph_t * pGraph );
    Abc_Obj_t * pRootNew;
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    int nNodesNew, nNodesOld;
    nNodesOld = Abc_NtkNodeNum(pNtk);
    // create the new structure of nodes
    pRootNew = Dec_GraphToNetwork( pNtk, pGraph );
    // remove the old nodes
    Abc_AigReplace( (Abc_Aig_t *)pNtk->pManFunc, pRoot, pRootNew, fUpdateLevel );
    // compare the gains
    nNodesNew = Abc_NtkNodeNum(pNtk);
    assert( nGain <= nNodesOld - nNodesNew );
}